

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMaterialSurfaceNSC.cpp
# Opt level: O2

void __thiscall
chrono::ChMaterialSurfaceNSC::ArchiveOUT(ChMaterialSurfaceNSC *this,ChArchiveOut *marchive)

{
  ChNameValue<float> local_a8;
  ChNameValue<float> local_90;
  ChNameValue<float> local_78;
  ChNameValue<float> local_60;
  ChNameValue<float> local_48;
  ChNameValue<float> local_30;
  
  ChArchiveOut::VersionWrite<chrono::ChMaterialSurfaceNSC>(marchive);
  ChMaterialSurface::ArchiveOUT(&this->super_ChMaterialSurface,marchive);
  local_30._value = (float *)&(this->super_ChMaterialSurface).field_0x1c;
  local_30._name = "cohesion";
  local_30._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_30);
  local_48._value = &this->dampingf;
  local_48._name = "dampingf";
  local_48._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_48);
  local_60._value = &this->compliance;
  local_60._name = "compliance";
  local_60._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_60);
  local_78._value = &this->complianceT;
  local_78._name = "complianceT";
  local_78._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_78);
  local_90._value = &this->complianceRoll;
  local_90._name = "complianceRoll";
  local_90._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_90);
  local_a8._value = &this->complianceSpin;
  local_a8._name = "complianceSpin";
  local_a8._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_a8);
  return;
}

Assistant:

void ChMaterialSurfaceNSC::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChMaterialSurfaceNSC>();

    // serialize parent class
    ChMaterialSurface::ArchiveOUT(marchive);

    // serialize all member data:
    marchive << CHNVP(cohesion);
    marchive << CHNVP(dampingf);
    marchive << CHNVP(compliance);
    marchive << CHNVP(complianceT);
    marchive << CHNVP(complianceRoll);
    marchive << CHNVP(complianceSpin);
}